

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Fad<double> *pFVar8;
  Fad<double> *pFVar9;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar10;
  double *pdVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pFVar8 = (this->left_->fadexpr_).left_;
  pdVar11 = &pFVar8->defaultVal;
  if ((pFVar8->dx_).num_elts != 0) {
    pdVar11 = (pFVar8->dx_).ptr_to_data + i;
  }
  pFVar9 = (this->left_->fadexpr_).right_;
  pdVar12 = &pFVar9->defaultVal;
  if ((pFVar9->dx_).num_elts != 0) {
    pdVar12 = (pFVar9->dx_).ptr_to_data + i;
  }
  dVar1 = pFVar9->val_;
  dVar2 = pFVar8->val_;
  dVar3 = *pdVar12;
  dVar4 = *pdVar11;
  pFVar10 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  dVar13 = cos(((pFVar10->fadexpr_).left_.constant_ * ((pFVar10->fadexpr_).right_)->val_) /
               (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar10 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pFVar8 = (pFVar10->fadexpr_).right_;
  pdVar11 = &pFVar8->defaultVal;
  if ((pFVar8->dx_).num_elts != 0) {
    pdVar11 = (pFVar8->dx_).ptr_to_data + i;
  }
  dVar5 = (pFVar10->fadexpr_).left_.constant_;
  dVar6 = (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar7 = *pdVar11;
  dVar14 = sin((dVar5 * pFVar8->val_) / dVar6);
  auVar15._8_8_ = ((this->left_->fadexpr_).left_)->val_;
  auVar15._0_8_ = -dVar7 * dVar5;
  auVar16._8_8_ = ((this->left_->fadexpr_).right_)->val_;
  auVar16._0_8_ = dVar6;
  auVar16 = divpd(auVar15,auVar16);
  return dVar14 * auVar16._0_8_ * auVar16._8_8_ +
         dVar13 * ((dVar4 * dVar1 - dVar2 * dVar3) / (dVar1 * dVar1));
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}